

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

BinaryExpr<const_unsigned_int_&,_const_unsigned_int_&> * __thiscall
Catch::ExprLhs<unsigned_int_const&>::operator==
          (BinaryExpr<const_unsigned_int_&,_const_unsigned_int_&> *__return_storage_ptr__,
          ExprLhs<unsigned_int_const&> *this,uint *rhs)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  StringRef local_40;
  
  puVar3 = *(uint **)this;
  uVar1 = *puVar3;
  uVar2 = *rhs;
  StringRef::StringRef(&local_40,"==");
  (__return_storage_ptr__->super_ITransientExpression).m_isBinaryExpression = true;
  (__return_storage_ptr__->super_ITransientExpression).m_result = uVar1 == uVar2;
  (__return_storage_ptr__->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_0022d2d0;
  __return_storage_ptr__->m_lhs = puVar3;
  (__return_storage_ptr__->m_op).m_start = local_40.m_start;
  (__return_storage_ptr__->m_op).m_size = local_40.m_size;
  __return_storage_ptr__->m_rhs = rhs;
  return __return_storage_ptr__;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }